

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassVariable.cpp
# Opt level: O2

void __thiscall hdc::ClassVariable::ClassVariable(ClassVariable *this,Token *token)

{
  Variable::Variable(&this->super_Variable);
  (this->super_Variable).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_0019c1e0;
  Token::operator=(&(this->super_Variable).token,token);
  (this->super_Variable).type = (Type *)0x0;
  ASTNode::setKind((ASTNode *)this,AST_CLASS_VARIABLE);
  return;
}

Assistant:

ClassVariable::ClassVariable(Token& token) {
    this->token = token;
    this->type = nullptr;
    setKind(AST_CLASS_VARIABLE);
}